

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

void Memory::
     DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,TempTracker<NumberTemp>>
               (AllocatorType *allocator,TempTracker<NumberTemp> *obj)

{
  Type_conflict pBVar1;
  Type pJVar2;
  Type_conflict pBVar3;
  Type_conflict pBVar4;
  
  pBVar1 = (obj->super_NumberTemp).upwardExposedMarkTempObjectLiveFields.head;
  if (pBVar1 != (Type_conflict)0x0) {
    pJVar2 = (obj->super_NumberTemp).upwardExposedMarkTempObjectLiveFields.alloc;
    pBVar4 = pJVar2->bvFreeList;
    do {
      pBVar3 = pBVar1;
      pBVar1 = pBVar3->next;
      pBVar3->next = pBVar4;
      pBVar4 = pBVar3;
    } while (pBVar1 != (Type)0x0);
    (obj->super_NumberTemp).upwardExposedMarkTempObjectLiveFields.lastFoundIndex =
         (Type_conflict)0x0;
    pJVar2->bvFreeList = pBVar3;
    (obj->super_NumberTemp).upwardExposedMarkTempObjectLiveFields.lastUsedNodePrevNextField =
         &(obj->super_NumberTemp).upwardExposedMarkTempObjectLiveFields.head;
  }
  pBVar1 = (obj->super_NumberTemp).elemLoadDependencies.head;
  if (pBVar1 != (Type_conflict)0x0) {
    pJVar2 = (obj->super_NumberTemp).elemLoadDependencies.alloc;
    pBVar4 = pJVar2->bvFreeList;
    do {
      pBVar3 = pBVar1;
      pBVar1 = pBVar3->next;
      pBVar3->next = pBVar4;
      pBVar4 = pBVar3;
    } while (pBVar1 != (Type)0x0);
    (obj->super_NumberTemp).elemLoadDependencies.lastFoundIndex = (Type_conflict)0x0;
    pJVar2->bvFreeList = pBVar3;
    (obj->super_NumberTemp).elemLoadDependencies.lastUsedNodePrevNextField =
         &(obj->super_NumberTemp).elemLoadDependencies.head;
  }
  TempTrackerBase::~TempTrackerBase((TempTrackerBase *)obj);
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,obj,
             0xa0);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj)
{
    obj->~T();

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size());
}